

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Read
          (CopyingFileInputStream *this,void *buffer,int size)

{
  int iVar1;
  LogMessage *pLVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  int result;
  LogMessage local_30;
  Voidify local_1d;
  int local_1c;
  void *pvStack_18;
  int size_local;
  void *buffer_local;
  CopyingFileInputStream *this_local;
  
  local_1c = size;
  pvStack_18 = buffer;
  buffer_local = this;
  if ((this->is_closed_ & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x74,"!is_closed_");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  do {
    sVar3 = read(this->file_,pvStack_18,(long)local_1c);
    iVar1 = (int)sVar3;
    bVar5 = false;
    if (iVar1 < 0) {
      piVar4 = __errno_location();
      bVar5 = *piVar4 == 4;
    }
  } while (bVar5);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    this->errno_ = *piVar4;
  }
  return iVar1;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Read(void* buffer, int size) {
  ABSL_CHECK(!is_closed_);

  int result;
  do {
    result = read(file_, buffer, size);
  } while (result < 0 && errno == EINTR);

  if (result < 0) {
    // Read error (not EOF).
    errno_ = errno;
  }

  return result;
}